

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.hpp
# Opt level: O2

intrusive_ptr<const_boost::xpressive::detail::traits<char>_> * __thiscall
boost::intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator=
          (intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *this,
          intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *rhs)

{
  traits<char> *ptVar1;
  intrusive_ptr<const_boost::xpressive::detail::traits<char>_> local_10;
  
  ptVar1 = rhs->px;
  if (ptVar1 == (traits<char> *)0x0) {
    ptVar1 = (traits<char> *)0x0;
  }
  else {
    LOCK();
    (ptVar1->super_counted_base<boost::xpressive::detail::traits<char>_>).count_.value_ =
         (ptVar1->super_counted_base<boost::xpressive::detail::traits<char>_>).count_.value_ + 1;
    UNLOCK();
  }
  local_10 = (intrusive_ptr<const_boost::xpressive::detail::traits<char>_>)this->px;
  this->px = ptVar1;
  ~intrusive_ptr(&local_10);
  return this;
}

Assistant:

intrusive_ptr & operator=(intrusive_ptr const & rhs)
    {
        this_type(rhs).swap(*this);
        return *this;
    }